

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O0

bool __thiscall
spvtools::SpirvTools::Parse
          (SpirvTools *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,
          HeaderParser *header_parser,InstructionParser *instruction_parser,
          spv_diagnostic *diagnostic)

{
  spv_const_context context;
  spv_result_t sVar1;
  pointer pIVar2;
  uint *code;
  size_type num_words;
  __1 local_59;
  spv_result_t status;
  spv_parsed_instruction_fn_t instruction_fn_wrapper;
  _func_spv_result_t_void_ptr_spv_endianness_t_uint32_t_uint32_t_uint32_t_uint32_t_uint32_t
  *local_48;
  spv_parsed_header_fn_t header_fn_wrapper;
  CxxParserContext parser_context;
  spv_diagnostic *diagnostic_local;
  InstructionParser *instruction_parser_local;
  HeaderParser *header_parser_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binary_local;
  SpirvTools *this_local;
  
  header_fn_wrapper = (spv_parsed_header_fn_t)header_parser;
  parser_context.header_parser = (HeaderParser *)instruction_parser;
  parser_context.instruction_parser = (InstructionParser *)diagnostic;
  local_48 = Parse(std::vector_const&,std::function_const&,std::function_const&,spv_diagnostic_t**)
             ::$_0::operator_cast_to_function_pointer((__0 *)((long)&instruction_fn_wrapper + 7));
  _status = Parse(std::vector_const&,std::function_const&,std::function_const&,spv_diagnostic_t**)::
            $_1::operator_cast_to_function_pointer(&local_59);
  pIVar2 = std::
           unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
           ::operator->(&this->impl_);
  context = pIVar2->context;
  code = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(binary);
  num_words = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(binary);
  sVar1 = spvBinaryParse(context,&header_fn_wrapper,code,num_words,local_48,_status,
                         (spv_diagnostic *)parser_context.instruction_parser);
  return sVar1 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Parse(const std::vector<uint32_t>& binary,
                       const HeaderParser& header_parser,
                       const InstructionParser& instruction_parser,
                       spv_diagnostic* diagnostic) {
  CxxParserContext parser_context = {header_parser, instruction_parser};

  spv_parsed_header_fn_t header_fn_wrapper =
      [](void* user_data, spv_endianness_t endianness, uint32_t magic,
         uint32_t version, uint32_t generator, uint32_t id_bound,
         uint32_t reserved) {
        CxxParserContext* ctx = reinterpret_cast<CxxParserContext*>(user_data);
        spv_parsed_header_t header = {magic, version, generator, id_bound,
                                      reserved};

        return ctx->header_parser(endianness, header);
      };

  spv_parsed_instruction_fn_t instruction_fn_wrapper =
      [](void* user_data, const spv_parsed_instruction_t* instruction) {
        CxxParserContext* ctx = reinterpret_cast<CxxParserContext*>(user_data);
        return ctx->instruction_parser(*instruction);
      };

  spv_result_t status = spvBinaryParse(
      impl_->context, &parser_context, binary.data(), binary.size(),
      header_fn_wrapper, instruction_fn_wrapper, diagnostic);
  return status == SPV_SUCCESS;
}